

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

void XPMP2::SoundUpdatesDone(void)

{
  bool bMute;
  char cVar1;
  
  if (gpSndSys == (long *)0x0) {
    return;
  }
  if (DAT_002ec78f == '\x01') {
    bMute = IsPaused();
    if (bMute) {
      cVar1 = '\x01';
      if (DAT_002ec798 != '\0') goto LAB_0023b88a;
    }
    else {
      if (DAT_002ec798 == '\0') goto LAB_0023b88a;
      cVar1 = '\0';
    }
    XPMPSoundMute(bMute);
    DAT_002ec798 = cVar1;
  }
LAB_0023b88a:
  (**(code **)(*gpSndSys + 0x48))();
  return;
}

Assistant:

void SoundUpdatesDone ()
{
    if (!gpSndSys) return;

    // Mute-on-Pause
    if (glob.bSoundMuteOnPause) {                           // shall act automatically on Pause?
        if (IsPaused()) {                                   // XP is paused?
            if (!glob.bSoundAutoMuted) {                    // ...but not yet muted?
                XPMPSoundMute(true);                        //    -> do mute
                glob.bSoundAutoMuted = true;
            }
        } else {                                            // XP is not paused
            if (glob.bSoundAutoMuted) {                     // ...but sound is auto-muted?
                XPMPSoundMute(false);                       //    -> unmute
                glob.bSoundAutoMuted = false;
            }
        }
    }

    // Have sound system do some last updates
    gpSndSys->Update();
}